

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid.h
# Opt level: O0

TV __thiscall Nova::Grid<float,_2>::Node(Grid<float,_2> *this,T_INDEX *index)

{
  int in_EDX;
  Vector<float,_2,_true> VVar1;
  Vector<int,_2,_true> local_38;
  Vector<float,_2,_true> local_30;
  Vector<float,_2,_true> local_28 [2];
  T_INDEX *index_local;
  Grid<float,_2> *this_local;
  
  index_local = index;
  this_local = this;
  Vector<int,_2,_true>::operator-(&local_38,in_EDX);
  Vector<float,_2,_true>::Vector<int>(&local_30,&local_38);
  Vector<float,_2,_true>::operator*(local_28,&local_30);
  VVar1 = Vector<float,_2,_true>::operator+
                    ((Vector<float,_2,_true> *)this,(Vector<float,_2,_true> *)(index + 1));
  return (TV)VVar1._data._M_elems;
}

Assistant:

TV Node(const T_INDEX& index) const
    {
        return domain.min_corner+TV(index-1)*dX;
    }